

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_time_pc.c
# Opt level: O0

int32_t gettime(time *tp)

{
  undefined1 auStack_28 [4];
  int ret;
  timeval now;
  time *tp_local;
  
  now.tv_usec = (__suseconds_t)tp;
  tp_local._4_4_ = gettimeofday((timeval *)auStack_28,(__timezone_ptr_t)0x0);
  if (tp_local._4_4_ == 0) {
    *(__time_t *)now.tv_usec = _auStack_28;
    *(__time_t *)(now.tv_usec + 8) = now.tv_sec * 1000;
    tp_local._4_4_ = 0;
  }
  return tp_local._4_4_;
}

Assistant:

int32_t gettime(struct time *tp)
{
    // WARNING: gettimeofday is subject to clock jitter caused by NTP or other services
    // changing the wall-clock time.
    //
    // Using gettimeofday instead of clock_gettime to simplify the Makefile, so that
    // this code can run on system with glibc versions < 2.17 without having to 
    // link with -lrt because -lrt is not available on OS-X or Windows.
#if 1
    struct timeval now;
    int ret = gettimeofday(&now, NULL);

    if (ret)
    {
        return ret;
    }
    tp->tv_sec = now.tv_sec;
    tp->tv_nsec = now.tv_usec * 1000;

    return 0;
#else
    struct timespec now;
    int32_t ret;

    ret = clock_gettime(CLOCK_MONOTONIC, &now);
    tp->tv_sec = now.tv_sec;
    tp->tv_nsec = now.tv_nsec;
    return ret;
#endif
}